

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O3

void Rml::StringUtilities::ExpandString
               (StringList *string_list,String *string,char delimiter,char quote_character,
               char unquote_character,bool ignore_repeated_delimiters)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  undefined3 in_register_00000089;
  char *start_ptr;
  byte *local_50;
  undefined4 local_44;
  byte *local_40;
  byte *local_38;
  
  local_44 = CONCAT31(in_register_00000089,ignore_repeated_delimiters);
  pbVar5 = (byte *)(string->_M_dataplus)._M_p;
  local_50 = (byte *)0x0;
  bVar2 = *pbVar5;
  if (bVar2 != 0) {
    pbVar1 = (byte *)0x0;
    iVar4 = 0;
    pbVar7 = pbVar5;
    do {
      pbVar6 = pbVar5;
      local_38 = pbVar7;
      while( true ) {
        pbVar5 = pbVar6 + 1;
        iVar3 = -(uint)(bVar2 == unquote_character);
        if (bVar2 == quote_character) {
          iVar3 = 1;
        }
        iVar4 = iVar3 + iVar4;
        if ((bVar2 != delimiter) || (iVar4 != 0)) break;
        if (pbVar1 == (byte *)0x0) {
          if ((char)local_44 == '\0') {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)string_list);
          }
        }
        else {
          local_40 = pbVar7 + 1;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&,char_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     string_list,(char **)&local_50,(char **)&local_40);
        }
        local_50 = (byte *)0x0;
        bVar2 = *pbVar5;
        pbVar1 = (byte *)0x0;
        iVar4 = 0;
        pbVar6 = pbVar5;
        if (bVar2 == 0) {
          return;
        }
      }
      if (((0x20 < bVar2) ||
          (((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0 || (pbVar7 = local_38, 0 < iVar4)))) &&
         (pbVar7 = pbVar6, pbVar1 == (byte *)0x0)) {
        pbVar1 = pbVar6;
        local_50 = pbVar6;
      }
      bVar2 = *pbVar5;
    } while (bVar2 != 0);
    if (pbVar1 != (byte *)0x0) {
      local_40 = pbVar7 + 1;
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)string_list,
                 (char **)&local_50,(char **)&local_40);
    }
  }
  return;
}

Assistant:

void StringUtilities::ExpandString(StringList& string_list, const String& string, const char delimiter, char quote_character, char unquote_character,
	bool ignore_repeated_delimiters)
{
	int quote_mode_depth = 0;
	const char* ptr = string.c_str();
	const char* start_ptr = nullptr;
	const char* end_ptr = ptr;

	while (*ptr)
	{
		// Increment the quote depth for each quote character encountered
		if (*ptr == quote_character)
		{
			++quote_mode_depth;
		}
		// And decrement it for every unquote character
		else if (*ptr == unquote_character)
		{
			--quote_mode_depth;
		}

		// If we encounter a delimiter while not in quote mode, add the item to the list
		if (*ptr == delimiter && quote_mode_depth == 0)
		{
			if (start_ptr)
				string_list.emplace_back(start_ptr, end_ptr + 1);
			else if (!ignore_repeated_delimiters)
				string_list.emplace_back();
			start_ptr = nullptr;
		}
		// Otherwise if its not white space or we're in quote mode, advance the pointers
		else if (!IsWhitespace(*ptr) || quote_mode_depth > 0)
		{
			if (!start_ptr)
				start_ptr = ptr;
			end_ptr = ptr;
		}

		ptr++;
	}

	// If there's data pending, add it.
	if (start_ptr)
		string_list.emplace_back(start_ptr, end_ptr + 1);
}